

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O1

void __thiscall OSSLRSA::~OSSLRSA(OSSLRSA *this)

{
  (this->super_AsymmetricAlgorithm)._vptr_AsymmetricAlgorithm = (_func_int **)&PTR__OSSLRSA_00151700
  ;
  if (this->pCurrentHash != (HashAlgorithm *)0x0) {
    (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
  }
  if (this->pSecondHash != (HashAlgorithm *)0x0) {
    (*this->pSecondHash->_vptr_HashAlgorithm[1])();
  }
  operator_delete(this);
  return;
}

Assistant:

OSSLRSA::~OSSLRSA()
{
	if (pCurrentHash != NULL)
	{
		delete pCurrentHash;
	}

	if (pSecondHash != NULL)
	{
		delete pSecondHash;
	}
}